

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_declaration.c
# Opt level: O3

void parse_declaration(Translation_Data *translation_data,Scope *scope,Queue *where_to_push,
                      char parse_function_definitions)

{
  Denotation_Type DVar1;
  char cVar2;
  Denotation_Prototype *prototype;
  Denoted_Function *function;
  AST_Type_Definition *data;
  AST_Object_Declaration *data_00;
  AST *pAVar3;
  AST_Declaration_Error *pAVar4;
  AST_Compound_Statement *pAVar5;
  AST_Function_Definition *data_01;
  char *error_message;
  bool bVar6;
  
  prototype = parse_declaration_specifiers_inner(translation_data,scope,'\x01');
  cVar2 = get_and_check(translation_data,KW_SEMI_COLUMN);
  if (cVar2 == '\0') {
    bVar6 = parse_function_definitions == '\0';
    do {
      function = (Denoted_Function *)parse_declarator(translation_data,scope,prototype);
      DVar1 = function->denotation;
      if (DVar1 != DT_Object) {
        if (DVar1 == DT_Typedef) {
          data = get_type_definition_tree((Denoted_Typedef *)function);
LAB_00141371:
          Queue_Push(where_to_push,data);
          goto LAB_001413b1;
        }
        if (DVar1 == DT_Function) {
          if ((bVar6) || (cVar2 = get_and_check(translation_data,KW_OPEN_CURLY), cVar2 == '\0')) {
            data = (AST_Type_Definition *)get_function_declaration_tree(scope,function);
            goto LAB_00141371;
          }
          pAVar5 = (AST_Compound_Statement *)parse_finish_compound_statement(translation_data,scope)
          ;
          function->body = pAVar5;
          data_01 = get_function_definition_tree(scope,function);
          Queue_Push(where_to_push,data_01);
          Scope_Push(scope,(Denoted *)function,translation_data);
        }
        else {
          pAVar4 = get_declaration_error_tree((Denoted *)function);
          Queue_Push(where_to_push,pAVar4);
          error_message = "declaration expected";
LAB_00141432:
          push_translation_error(error_message,translation_data);
        }
        break;
      }
      data_00 = get_object_declaration_tree((Denoted_Object *)function);
      Queue_Push(where_to_push,data_00);
      cVar2 = get_and_check(translation_data,KW_EQ);
      if (cVar2 != '\0') {
        pAVar3 = parse_assignment_expression(translation_data,scope);
        *(AST **)&function->function_specifier = pAVar3;
      }
LAB_001413b1:
      Scope_Push(scope,(Denoted *)function,translation_data);
      cVar2 = get_and_check(translation_data,KW_COMMA);
      if ((cVar2 == '\0') && (cVar2 = check(translation_data,KW_SEMI_COLUMN,0), cVar2 == '\0')) {
        pAVar4 = get_declaration_error_tree((Denoted *)0x0);
        Queue_Push(where_to_push,pAVar4);
        error_message = "semi column expected";
        goto LAB_00141432;
      }
      cVar2 = get_and_check(translation_data,KW_SEMI_COLUMN);
      bVar6 = true;
    } while (cVar2 == '\0');
  }
  free(prototype);
  return;
}

Assistant:

void parse_declaration(struct Translation_Data *translation_data,struct Scope *scope,struct Queue *where_to_push,char parse_function_definitions)
{
	struct Denotation_Prototype *prototype;
	struct Denoted *hold;

	prototype=parse_declaration_specifiers(translation_data,scope);
	while(!get_and_check(translation_data,KW_SEMI_COLUMN))
	{
		hold=parse_declarator(translation_data,scope,prototype);

		if(hold->denotation==DT_Function)
		{
			/*check if this is a function definition*/
			if(parse_function_definitions && get_and_check(translation_data,KW_OPEN_CURLY))
			{
				((struct Denoted_Function*)hold) ->body=
				       	(struct AST_Compound_Statement*)parse_finish_compound_statement(translation_data,scope);
				Queue_Push(where_to_push,get_function_definition_tree(scope,(struct Denoted_Function*)hold));
				Scope_Push(scope,hold,translation_data);
				break;
			}
			/*this is a function declaration*/
			Queue_Push(where_to_push,get_function_declaration_tree(scope,(struct Denoted_Function*)hold));
		}else if(hold->denotation==DT_Typedef)
		{
			Queue_Push(where_to_push,get_type_definition_tree((struct Denoted_Typedef*)hold));
		}else if(hold->denotation==DT_Object)
		{
			Queue_Push(where_to_push,get_object_declaration_tree((struct Denoted_Object*)hold));
			if(get_and_check(translation_data,KW_EQ))
				((struct Denoted_Object*)hold)->initializer=parse_initializer(translation_data,scope,(struct Denoted_Object*)hold);
		}else
		{
			/*TODO error*/
			Queue_Push(where_to_push,get_declaration_error_tree(hold));
			push_translation_error("declaration expected",translation_data);

			/*search for end of erronous declaration*/
			break;
		}

		Scope_Push(scope,hold,translation_data);
		parse_function_definitions=0;
		if(!get_and_check(translation_data,KW_COMMA) && !check(translation_data,KW_SEMI_COLUMN,0))
		{
			/*TODO error*/
			Queue_Push(where_to_push,get_declaration_error_tree(NULL));
			push_translation_error("semi column expected",translation_data);
			break;
		}
	}

	free(prototype);

}